

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O0

void __thiscall
fizplex::BaseTestSingular_InvertIsFalse_Test::TestBody(BaseTestSingular_InvertIsFalse_Test *this)

{
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  bool bVar1;
  invalid_argument *anon_var_0;
  Base b;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ColMatrix m;
  Base *in_stack_fffffffffffffde0;
  SVector *in_stack_fffffffffffffe10;
  undefined1 ***pppuVar2;
  iterator in_stack_fffffffffffffe18;
  undefined1 ***pppuVar3;
  ColMatrix *in_stack_fffffffffffffe20;
  initializer_list<fizplex::SVector> in_stack_fffffffffffffe28;
  ColMatrix *in_stack_fffffffffffffe78;
  Base *in_stack_fffffffffffffe80;
  ConstCharPtr local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined1 **local_90;
  undefined8 *local_88 [3];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 **local_40;
  undefined8 local_38;
  
  local_90 = (undefined1 **)local_88;
  local_b8 = 2;
  uStack_b0 = 0x3ff0000000000000;
  local_c8 = 1;
  uStack_c0 = 0x3ff0000000000000;
  local_d8 = 0;
  uStack_d0 = 0x3ff0000000000000;
  local_a0 = &local_d8;
  local_98 = 3;
  l._M_len = (size_type)in_stack_fffffffffffffe20;
  l._M_array = in_stack_fffffffffffffe18;
  SVector::SVector(in_stack_fffffffffffffe10,l);
  local_90 = (undefined1 **)local_70;
  local_108 = 2;
  uStack_100 = 0x3ff0000000000000;
  local_118 = 1;
  uStack_110 = 0x3ff0000000000000;
  local_128 = 0;
  uStack_120 = 0x3ff0000000000000;
  local_f8 = &local_128;
  local_f0 = 3;
  l_00._M_len = (size_type)in_stack_fffffffffffffe20;
  l_00._M_array = in_stack_fffffffffffffe18;
  SVector::SVector(in_stack_fffffffffffffe10,l_00);
  local_90 = (undefined1 **)local_58;
  local_148 = 2;
  uStack_140 = 0x3ff0000000000000;
  local_158 = 1;
  uStack_150 = 0x3ff0000000000000;
  local_168 = 0;
  uStack_160 = 0x3ff0000000000000;
  local_138 = &local_168;
  local_130 = 3;
  l_01._M_len = (size_type)in_stack_fffffffffffffe20;
  l_01._M_array = in_stack_fffffffffffffe18;
  SVector::SVector(in_stack_fffffffffffffe10,l_01);
  local_40 = (undefined1 **)local_88;
  local_38 = 3;
  ColMatrix::ColMatrix
            (in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18,
             (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe28);
  pppuVar3 = (undefined1 ***)local_88;
  pppuVar2 = &local_40;
  do {
    pppuVar2 = pppuVar2 + -3;
    SVector::~SVector((SVector *)0x1bfb9b);
  } while (pppuVar2 != pppuVar3);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_170,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_170);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Base::Base(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      Base::~Base(in_stack_fffffffffffffde0);
    }
    local_170.value =
         "Expected: Base b(m) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)&stack0xfffffffffffffe30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xfffffffffffffe28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
             ,0xc,local_170.value);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xfffffffffffffe28,(Message *)&stack0xfffffffffffffe30);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe28);
  testing::Message::~Message((Message *)0x1bfde2);
  ColMatrix::~ColMatrix((ColMatrix *)0x1bfe31);
  return;
}

Assistant:

TEST(BaseTestSingular, InvertIsFalse) {
  const ColMatrix m(3, 3,
                    {{{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}}});
  EXPECT_THROW(Base b(m), std::invalid_argument);
}